

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O1

void __thiscall
DIS::ElectromagneticEmissionSystemData::unmarshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  uchar *c;
  pointer pEVar1;
  pointer pEVar2;
  pointer pEVar3;
  ulong uVar4;
  ElectromagneticEmissionBeamData x;
  ElectromagneticEmissionBeamData local_b0;
  
  DataStream::operator>>(dataStream,&this->_systemDataLength);
  c = &this->_numberOfBeams;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_emissionsPadding2);
  EmitterSystem::unmarshal(&this->_emitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_location,dataStream);
  pEVar1 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar3 = pEVar1;
  if (pEVar2 != pEVar1) {
    do {
      (**pEVar3->_vptr_ElectromagneticEmissionBeamData)(pEVar3);
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar2);
    (this->_beamDataRecords).
    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1;
  }
  if (*c != '\0') {
    uVar4 = 0;
    do {
      ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData(&local_b0);
      ElectromagneticEmissionBeamData::unmarshal(&local_b0,dataStream);
      std::
      vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ::push_back(&this->_beamDataRecords,&local_b0);
      ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&local_b0);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *c);
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _systemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _emissionsPadding2;
    _emitterSystem.unmarshal(dataStream);
    _location.unmarshal(dataStream);

    _beamDataRecords.clear();
    for(size_t idx = 0; idx < _numberOfBeams; idx++)
    {
        ElectromagneticEmissionBeamData x;
        x.unmarshal(dataStream);
        _beamDataRecords.push_back(x);
    }
}